

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
clear(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this)

{
  if ((this->no_delete_ == false) && (this->array_ != (unit_t *)0x0)) {
    operator_delete__(this->array_);
  }
  if (this->used_ != (uchar *)0x0) {
    operator_delete__(this->used_);
  }
  this->no_delete_ = false;
  this->array_ = (unit_t *)0x0;
  this->used_ = (uchar *)0x0;
  this->size_ = 0;
  this->alloc_size_ = 0;
  return;
}

Assistant:

void clear() {
    if (!no_delete_)
      delete [] array_;
    delete [] used_;
    array_ = 0;
    used_ = 0;
    alloc_size_ = 0;
    size_ = 0;
    no_delete_ = false;
  }